

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall
HEkk::initialiseSimplexLpBasisAndFactor(HEkk *this,bool only_from_known_basis)

{
  uint uVar1;
  HighsSparseMatrix *pHVar2;
  undefined8 uVar3;
  byte in_SIL;
  HEkk *in_RDI;
  HighsSimplexAnalysis *unaff_retaddr;
  HighsTimer *in_stack_00000008;
  HighsOptions *in_stack_00000010;
  HEkk *in_stack_00000018;
  HighsLp *in_stack_00000020;
  HSimplexNla *in_stack_00000028;
  HighsSparseMatrix *in_stack_00000040;
  HighsInt rank_deficiency;
  HighsSparseMatrix *local_scaled_a_matrix;
  HighsSimplexAnalysis *timer;
  undefined4 uVar4;
  HEkk *in_stack_ffffffffffffffa0;
  HighsLogOptions *log_options_;
  HighsInt *in_stack_ffffffffffffffa8;
  LpAction action;
  HEkk *in_stack_ffffffffffffffb0;
  HighsLp *for_lp;
  HSimplexNla *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI->status_).has_basis & 1U) == 0) {
    setBasis(in_RDI);
  }
  pHVar2 = getScaledAMatrixPointer(in_stack_ffffffffffffffa0);
  uVar4 = (undefined4)((ulong)pHVar2 >> 0x20);
  if (((in_RDI->status_).has_nla & 1U) == 0) {
    action = (LpAction)((ulong)&in_RDI->simplex_nla_ >> 0x20);
    in_stack_ffffffffffffffb0 = (HEkk *)&in_RDI->lp_;
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x76d3df);
    HSimplexNla::setup(in_stack_00000028,in_stack_00000020,(HighsInt *)in_stack_00000018,
                       in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000040,
                       (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    (in_RDI->status_).has_nla = true;
  }
  else {
    for_lp = (HighsLp *)&in_RDI->simplex_nla_;
    this_00 = (HSimplexNla *)&in_RDI->lp_;
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x76d384);
    timer = &in_RDI->analysis_;
    HSimplexNla::setPointers
              (this_00,for_lp,(HighsSparseMatrix *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,(HighsOptions *)in_stack_ffffffffffffffa0,
               (HighsTimer *)timer,(HighsSimplexAnalysis *)in_RDI);
    action = (LpAction)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    uVar4 = (undefined4)((ulong)timer >> 0x20);
  }
  if (((in_RDI->status_).has_invert & 1U) == 0) {
    uVar1 = computeFactor(in_stack_00000018);
    if (uVar1 != 0) {
      log_options_ = &(in_RDI->options_->super_HighsOptionsStruct).log_options;
      uVar3 = std::__cxx11::string::c_str();
      highsLogDev(log_options_,kInfo,
                  "HEkk::initialiseSimplexLpBasisAndFactor (%s) Rank_deficiency %d: Id = %d; UpdateCount = %d\n"
                  ,uVar3,(ulong)uVar1,(ulong)(uint)(in_RDI->basis_).debug_id,
                  CONCAT44(uVar4,(in_RDI->basis_).debug_update_count));
      if ((in_SIL & 1) != 0) {
        highsLogDev(&(in_RDI->options_->super_HighsOptionsStruct).log_options,kError,
                    "Supposed to be a full-rank basis, but incorrect\n");
        return kError;
      }
      handleRankDeficiency(in_stack_00000018);
      updateStatus(in_stack_ffffffffffffffb0,action);
      setNonbasicMove(in_RDI);
      (in_RDI->status_).has_basis = true;
      (in_RDI->status_).has_invert = true;
      (in_RDI->status_).has_fresh_invert = true;
    }
    resetSyntheticClock(in_RDI);
  }
  return kOk;
}

Assistant:

HighsStatus HEkk::initialiseSimplexLpBasisAndFactor(
    const bool only_from_known_basis) {
  // This is normally called only from HEkk::initialiseForSolve, with
  // only_from_known_basis = false.
  //
  // In this case, if there is no existing simplex basis then a
  // logical basis is set up. Otherwise the existing simplex basis is
  // factorized, with logicals introduced to handle rank deficiency.
  //
  // It is also called from HighsSolution's
  // formSimplexLpBasisAndFactor, with only_from_known_basis = true or
  // false. In both cases a simplex basis is known.
  //
  // Calls with only_from_known_basis = true originate from
  // Highs::getBasicVariablesInterface, and are made when
  // Highs::getBasicVariables has been called and there is no
  // factorization of the current basis matrix. No rank deficiency
  // handling is permitted so, if it occurs, an error must be
  // returned.
  //
  // Calls with only_from_known_basis = false originate from
  // Highs::setBasis. The simplex basis should be non-singular since
  // it's come from a HighsBasis that is either non-alien, or from an
  // alien HighsBasis that's been checked/completed. However, it's
  // conceivable that a singularity could occur, and it's fine to
  // accommodate it.
  //
  // If only_from_known_basis is true, then there should be a simplex
  // basis to use
  if (only_from_known_basis) assert(status_.has_basis);
  // If there is no simplex basis, set up a logical basis
  if (!status_.has_basis) setBasis();
  // The simplex NLA operates in the scaled space if the LP has
  // scaling factors. If they exist but haven't been applied, then the
  // simplex NLA needs a separate, scaled constraint matrix. Thus
  // getScaledAMatrixPointer() returns a pointer to either the
  // constraint matrix or a scaled copy (that is a member of the HEkk
  // class), with the latter returned if the LP has scaling factors
  // but is unscaled.
  //
  HighsSparseMatrix* local_scaled_a_matrix = getScaledAMatrixPointer();
  //
  // If simplex NLA is set up, pass the pointers that it uses. It
  // deduces any scaling factors that it must use by inspecting
  // whether the LP has scaling factors, and whether it is scaled.
  //
  // If simplex NLA is not set up, then it will be done if
  //
  if (this->status_.has_nla) {
    assert(lpFactorRowCompatible());
    this->simplex_nla_.setPointers(
        &(this->lp_), local_scaled_a_matrix, this->basis_.basicIndex_.data(),
        this->options_, this->timer_, &(this->analysis_));
  } else {
    // todo @ Julian: this fails on glass4
    assert(info_.factor_pivot_threshold >= options_->factor_pivot_threshold);
    simplex_nla_.setup(
        &(this->lp_),                     //&lp_,
        this->basis_.basicIndex_.data(),  // basis_.basicIndex_.data(),
        this->options_,                   // options_,
        this->timer_,                     // timer_,
        &(this->analysis_),               //&analysis_,
        local_scaled_a_matrix, this->info_.factor_pivot_threshold);
    status_.has_nla = true;
  }

  if (!status_.has_invert) {
    const HighsInt rank_deficiency = computeFactor();
    if (rank_deficiency) {
      // Basis is rank deficient
      highsLogDev(
          options_->log_options, HighsLogType::kInfo,
          "HEkk::initialiseSimplexLpBasisAndFactor (%s) Rank_deficiency %d: Id "
          "= "
          "%d; UpdateCount = %d\n",
          basis_.debug_origin_name.c_str(), (int)rank_deficiency,
          (int)basis_.debug_id, (int)basis_.debug_update_count);
      if (only_from_known_basis) {
        // If only this basis should be used, then return error
        highsLogDev(options_->log_options, HighsLogType::kError,
                    "Supposed to be a full-rank basis, but incorrect\n");
        return HighsStatus::kError;
      }
      // Account for rank deficiency by correcting nonbasicFlag
      handleRankDeficiency();
      this->updateStatus(LpAction::kNewBasis);
      setNonbasicMove();
      status_.has_basis = true;
      status_.has_invert = true;
      status_.has_fresh_invert = true;
    }
    // Record the synthetic clock for INVERT, and zero it for UPDATE
    resetSyntheticClock();
  }
  assert(status_.has_invert);
  return HighsStatus::kOk;
}